

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

int __thiscall CTcSymObjBase::has_superclass(CTcSymObjBase *this,CTcSymObj *sc_sym)

{
  CTPNSuperclass *pCVar1;
  textchar_t *ptVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar5;
  CTcSymObjBase *this_00;
  
  pCVar1 = this->sc_name_head_;
  do {
    if (pCVar1 == (CTPNSuperclass *)0x0) {
      return 0;
    }
    pCVar5 = *(CTcPrsSymtab **)((long)G_prs + 0x80);
    ptVar2 = *(textchar_t **)((long)pCVar1 + 0x20);
    sVar3 = *(size_t *)((long)pCVar1 + 0x28);
    do {
      iVar4 = (*pCVar5->_vptr_CTcPrsSymtab[2])(pCVar5,ptVar2,sVar3);
      this_00 = (CTcSymObjBase *)CONCAT44(extraout_var,iVar4);
      if (this_00 != (CTcSymObjBase *)0x0) {
        (*(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
          _vptr_CVmHashEntry[0xf])(this_00);
        if (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                     super_CVmHashEntry.field_0x24 == 2) {
          if (this_00 == &sc_sym->super_CTcSymObjBase) {
            return 1;
          }
          iVar4 = has_superclass(this_00,sc_sym);
          if (iVar4 != 0) {
            return 1;
          }
        }
        break;
      }
      pCVar5 = pCVar5->parent_;
    } while (pCVar5 != (CTcPrsSymtab *)0x0);
    pCVar1 = *(CTPNSuperclass **)((long)pCVar1 + 8);
  } while( true );
}

Assistant:

int CTcSymObjBase::has_superclass(class CTcSymObj *sc_sym) const
{
    /* 
     *   Scan my direct superclasses.  For each one, check to see if my
     *   superclass matches the given superclass, or if my superclass
     *   inherits from the given superclass.  
     */
    for (CTPNSuperclass *entry = sc_name_head_ ; entry != 0 ;
         entry = entry->nxt_)
    {
        /* look up this symbol */
        CTcSymObj *entry_sym = (CTcSymObj *)G_prs->get_global_symtab()->find(
            entry->get_sym_txt(), entry->get_sym_len());

        /* 
         *   if the entry's symbol doesn't exist or isn't an object symbol,
         *   skip it 
         */
        if (entry_sym == 0 || entry_sym->get_type() != TC_SYM_OBJ)
            continue;

        /* 
         *   if it matches the given superclass, we've found the given
         *   superclass among our direct superclasses, so we definitely have
         *   the given superclass 
         */
        if (entry_sym == sc_sym)
            return TRUE;

        /* 
         *   ask the symbol if the given class is among its direct or
         *   indirect superclasses - if it's a superclass of my superclass,
         *   it's also my superclass 
         */
        if (entry_sym->has_superclass(sc_sym))
            return TRUE;
    }

    /* 
     *   we didn't find the given class anywhere among our superclasses or
     *   their superclasses, so it must not be a superclass of ours 
     */
    return FALSE;
}